

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O0

void __thiscall Omega_index_list_Test::TestBody(Omega_index_list_Test *this)

{
  bool bVar1;
  __tuple_element_t<3UL,_tuple<const_char_*,_int,_int,_double>_> *expected;
  __tuple_element_t<6UL,_tuple<int,_int,_int,_const_char_*,_int,_int,_double>_> *actual;
  char *message;
  tuple<int,_int,_int,_const_char_*,_int,_int,_double> *in_RDX;
  AssertHelper local_58;
  Message local_50 [3];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  __type t1;
  Omega_index_list_Test *this_local;
  
  omega::make_index_list<3,2,1,6,std::tuple<int,int,int,char_const*,int,int,double>const&>
            ((__type *)&gtest_ar.message_,(omega *)&::t,in_RDX);
  expected = std::get<3ul,char_const*,int,int,double>
                       ((tuple<const_char_*,_int,_int,_double> *)&gtest_ar.message_);
  actual = std::get<6ul,int,int,int,char_const*,int,int,double>(&::t);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_38,"std::get<3>(t1)","std::get<6>(t)",expected,actual);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(Omega, index_list)
{
    auto const t1 = omega::make_index_list<3, 2, 1, 6>(t); // decltype(t3) = std::tuple<const char*, int, int, double>

    EXPECT_EQ (std::get<3>(t1), std::get<6>(t));
}